

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  float *pfVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  size_t sVar6;
  PrimRefMB *pPVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 uVar13;
  long lVar14;
  size_t index;
  long lVar15;
  size_t *psVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  BufferView<embree::Vec3fa> *pBVar23;
  ulong uVar24;
  BufferView<embree::Vec3fa> *pBVar25;
  ulong uVar26;
  unsigned_long uVar27;
  float fVar28;
  ulong uVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  uint uVar37;
  float fVar38;
  uint uVar43;
  float fVar44;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar45;
  undefined1 auVar46 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  undefined1 auVar49 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar54;
  undefined1 auVar55 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  undefined1 auVar57 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar58;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar59;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  float __x;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar66;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar68;
  undefined1 auVar69 [12];
  undefined1 auVar70 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar71;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar72;
  float fVar73;
  undefined1 auVar74 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar75;
  undefined1 auVar76 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar77;
  undefined1 auVar78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar79;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar80;
  undefined1 auVar81 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar82;
  undefined1 auVar83 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar84;
  size_t local_180;
  uint local_168;
  ulong local_148;
  unsigned_long local_110;
  ushort local_100;
  size_t local_f8;
  uint local_50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar61;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar32 = r->_begin;
  uVar27 = r->_end;
  aVar65 = _DAT_01f7a9f0;
  aVar68 = _DAT_01f7aa00;
  aVar72 = _DAT_01f7aa00;
  aVar80 = _DAT_01f7a9f0;
  aVar82 = _DAT_01f7aa00;
  aVar84 = _DAT_01f7a9f0;
  if (uVar32 < uVar27) {
    local_f8 = k;
    fVar38 = 0.0;
    fVar44 = 1.0;
    fVar51 = 1.0;
    local_110 = 0;
    local_180 = 0;
    uVar29 = 0;
    fVar73 = 0.0;
    do {
      fVar35 = (this->super_GridMesh).super_Geometry.time_range.lower;
      fVar28 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
      fVar34 = t0t1->upper;
      fVar52 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar35;
      fVar33 = floorf(((t0t1->lower - fVar35) / fVar52) * 1.0000002 * fVar28);
      fVar34 = ceilf(((fVar34 - fVar35) / fVar52) * 0.99999976 * fVar28);
      if (uVar32 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar21 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar31 = *(long *)&(this->super_GridMesh).field_0x68 * uVar32;
        uVar12 = *(uint *)(lVar5 + lVar31);
        if (uVar12 < uVar21) {
          uVar3 = *(ushort *)(lVar5 + 10 + lVar31);
          uVar11 = (ulong)uVar3;
          uVar37 = *(uint *)(lVar5 + 4 + lVar31);
          uVar4 = *(ushort *)(lVar5 + 8 + lVar31);
          uVar24 = (ulong)uVar4;
          if (((uint)uVar4 + uVar37 * (uVar3 - 1) + uVar12) - 1 < uVar21) {
            if (uVar3 != 0) {
              fVar35 = 0.0;
              if (0.0 <= fVar33) {
                fVar35 = fVar33;
              }
              uVar18 = (uint)fVar35;
              if (fVar28 <= fVar34) {
                fVar34 = fVar28;
              }
              uVar21 = 0;
              do {
                if (uVar4 != 0) {
                  uVar26 = 0;
                  do {
                    if (uVar18 <= (uint)(int)fVar34) {
                      psVar16 = &(this->super_GridMesh).vertices.items[(int)uVar18].
                                 super_RawBufferView.stride;
                      uVar19 = (long)(int)uVar18;
                      do {
                        lVar14 = *psVar16 * (uVar21 * uVar37 + (ulong)uVar12 + uVar26);
                        pfVar1 = (float *)(((RawBufferView *)(psVar16 + -2))->ptr_ofs + lVar14);
                        auVar41._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                        auVar41._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                        auVar41._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                        auVar41._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                        uVar13 = movmskps((int)lVar14,auVar41);
                        if ((~(byte)uVar13 & 7) != 0) goto LAB_009ebb00;
                        uVar19 = uVar19 + 1;
                        psVar16 = psVar16 + 7;
                      } while (uVar19 <= (ulong)(long)(int)fVar34);
                    }
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar24);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar11);
              if (uVar3 == 1) goto LAB_009ebb00;
            }
            local_148 = 0;
            do {
              uVar12 = (uint)local_148;
              if ((short)uVar24 == 1) {
                uVar24 = 1;
              }
              else {
                sVar30 = uVar29;
                uVar37 = 0;
                do {
                  uVar21 = (ulong)uVar37;
                  uVar29 = uVar21 + 3;
                  fVar28 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                  fVar34 = (this->super_GridMesh).super_Geometry.time_range.lower;
                  fVar52 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar34;
                  fVar53 = (t0t1->lower - fVar34) / fVar52;
                  fVar52 = (t0t1->upper - fVar34) / fVar52;
                  fVar34 = fVar28 * fVar53;
                  __x = fVar28 * fVar52;
                  fVar35 = floorf(fVar34);
                  fVar33 = ceilf(__x);
                  iVar9 = (int)fVar35;
                  if ((int)fVar35 < 0) {
                    iVar9 = -1;
                  }
                  if (fVar35 <= 0.0) {
                    fVar35 = 0.0;
                  }
                  fVar36 = fVar33;
                  if (fVar28 <= fVar33) {
                    fVar36 = fVar28;
                  }
                  iVar10 = (int)fVar28 + 1;
                  if ((int)fVar33 < (int)fVar28 + 1) {
                    iVar10 = (int)fVar33;
                  }
                  uVar3 = *(ushort *)(lVar5 + 10 + lVar31);
                  uVar26 = (ulong)uVar3;
                  uVar11 = uVar26;
                  if (local_148 + 3 < uVar26) {
                    uVar11 = local_148 + 3;
                  }
                  local_100 = (ushort)uVar24;
                  local_168 = (uint)uVar3;
                  aVar54 = DAT_01f7a9f0._0_12_;
                  aVar66 = DAT_01f7aa00._0_12_;
                  aVar39 = _DAT_01f7aa00;
                  aVar62 = _DAT_01f7a9f0;
                  aVar75 = _DAT_01f7aa00;
                  aVar79 = _DAT_01f7a9f0;
                  if (local_148 < uVar26) {
                    lVar14 = (long)(int)fVar35;
                    pBVar25 = (this->super_GridMesh).vertices.items;
                    uVar19 = lVar14 * 0x38;
                    pBVar23 = pBVar25 + lVar14;
                    uVar26 = uVar24;
                    if (uVar29 < uVar24) {
                      uVar26 = uVar29;
                    }
                    uVar17 = local_148;
                    aVar47 = _DAT_01f7a9f0;
                    aVar60 = _DAT_01f7aa00;
                    do {
                      if (uVar37 < local_100) {
                        sVar6 = (pBVar23->super_RawBufferView).stride;
                        pauVar22 = (undefined1 (*) [16])
                                   ((pBVar23->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar5 + lVar31) + uVar21 +
                                   *(uint *)(lVar5 + 4 + lVar31) * uVar17) * sVar6);
                        lVar15 = uVar26 - uVar21;
                        do {
                          auVar41 = *pauVar22;
                          auVar64._0_4_ =
                               -(uint)(auVar41._0_4_ < 1.844e+18 && -1.844e+18 < auVar41._0_4_);
                          auVar64._4_4_ =
                               -(uint)(auVar41._4_4_ < 1.844e+18 && -1.844e+18 < auVar41._4_4_);
                          auVar64._8_4_ =
                               -(uint)(auVar41._8_4_ < 1.844e+18 && -1.844e+18 < auVar41._8_4_);
                          auVar64._12_4_ =
                               -(uint)(auVar41._12_4_ < 1.844e+18 && -1.844e+18 < auVar41._12_4_);
                          uVar13 = movmskps((int)uVar19,auVar64);
                          uVar19 = (ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
                          aVar48 = _DAT_01f7a9f0;
                          aVar61 = _DAT_01f7aa00;
                          if ((~(byte)uVar13 & 7) != 0) goto LAB_009eb4ba;
                          aVar47.m128 = (__m128)minps(aVar47.m128,auVar41);
                          aVar60.m128 = (__m128)maxps(aVar60.m128,auVar41);
                          pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar6);
                          lVar15 = lVar15 + -1;
                        } while (lVar15 != 0);
                      }
                      uVar17 = uVar17 + 1;
                      aVar48 = aVar47;
                      aVar61 = aVar60;
                    } while (uVar17 != uVar11);
LAB_009eb4ba:
                    aVar59 = aVar61.field_1;
                    aVar45 = aVar48.field_1;
                    lVar15 = (long)(int)fVar36;
                    pBVar25 = pBVar25 + lVar15;
                    uVar26 = uVar24;
                    if (uVar29 < uVar24) {
                      uVar26 = uVar29;
                    }
                    uVar19 = local_148;
                    aVar56 = _DAT_01f7a9f0;
                    aVar67 = _DAT_01f7aa00;
                    do {
                      if (uVar37 < local_100) {
                        uVar17 = *(uint *)(lVar5 + 4 + lVar31) * uVar19;
                        sVar6 = (pBVar25->super_RawBufferView).stride;
                        pauVar22 = (undefined1 (*) [16])
                                   ((pBVar25->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar5 + lVar31) + uVar21 + uVar17) * sVar6);
                        lVar20 = uVar26 - uVar21;
                        do {
                          auVar41 = *pauVar22;
                          auVar78._0_4_ =
                               -(uint)(auVar41._0_4_ < 1.844e+18 && -1.844e+18 < auVar41._0_4_);
                          auVar78._4_4_ =
                               -(uint)(auVar41._4_4_ < 1.844e+18 && -1.844e+18 < auVar41._4_4_);
                          auVar78._8_4_ =
                               -(uint)(auVar41._8_4_ < 1.844e+18 && -1.844e+18 < auVar41._8_4_);
                          auVar78._12_4_ =
                               -(uint)(auVar41._12_4_ < 1.844e+18 && -1.844e+18 < auVar41._12_4_);
                          uVar13 = movmskps((int)uVar17,auVar78);
                          uVar17 = (ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
                          aVar47 = _DAT_01f7a9f0;
                          aVar60 = _DAT_01f7aa00;
                          if ((~(byte)uVar13 & 7) != 0) goto LAB_009eb54a;
                          aVar56.m128 = (__m128)minps(aVar56.m128,auVar41);
                          aVar67.m128 = (__m128)maxps(aVar67.m128,auVar41);
                          pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar6);
                          lVar20 = lVar20 + -1;
                        } while (lVar20 != 0);
                      }
                      uVar19 = uVar19 + 1;
                      aVar47 = aVar56;
                      aVar60 = aVar67;
                    } while (uVar19 != uVar11);
LAB_009eb54a:
                    aVar66 = aVar60.field_1;
                    aVar54 = aVar47.field_1;
                    if (iVar10 - iVar9 != 1) {
                      if (uVar12 < local_168) {
                        pBVar23 = (this->super_GridMesh).vertices.items;
                        uVar26 = uVar24;
                        if (uVar29 < uVar24) {
                          uVar26 = uVar29;
                        }
                        uVar19 = local_148;
                        do {
                          if (uVar37 < local_100) {
                            uVar17 = *(uint *)(lVar5 + 4 + lVar31) * uVar19;
                            sVar6 = pBVar23[lVar14 + 1].super_RawBufferView.stride;
                            pauVar22 = (undefined1 (*) [16])
                                       (pBVar23[lVar14 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar31) + uVar21 + uVar17) * sVar6);
                            lVar20 = uVar26 - uVar21;
                            do {
                              auVar41 = *pauVar22;
                              auVar83._0_4_ =
                                   -(uint)(auVar41._0_4_ < 1.844e+18 && -1.844e+18 < auVar41._0_4_);
                              auVar83._4_4_ =
                                   -(uint)(auVar41._4_4_ < 1.844e+18 && -1.844e+18 < auVar41._4_4_);
                              auVar83._8_4_ =
                                   -(uint)(auVar41._8_4_ < 1.844e+18 && -1.844e+18 < auVar41._8_4_);
                              auVar83._12_4_ =
                                   -(uint)(auVar41._12_4_ < 1.844e+18 && -1.844e+18 < auVar41._12_4_
                                          );
                              uVar13 = movmskps((int)uVar17,auVar83);
                              uVar17 = (ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
                              aVar39 = _DAT_01f7aa00;
                              aVar62 = _DAT_01f7a9f0;
                              if ((~(byte)uVar13 & 7) != 0) goto LAB_009eb6a0;
                              aVar79.m128 = (__m128)minps(aVar79.m128,auVar41);
                              aVar75.m128 = (__m128)maxps(aVar75.m128,auVar41);
                              pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar6);
                              lVar20 = lVar20 + -1;
                            } while (lVar20 != 0);
                          }
                          uVar19 = uVar19 + 1;
                          aVar39 = aVar75;
                          aVar62 = aVar79;
                        } while (uVar19 != uVar11);
LAB_009eb6a0:
                        uVar26 = uVar24;
                        if (uVar29 < uVar24) {
                          uVar26 = uVar29;
                        }
                        uVar19 = local_148;
                        aVar56 = _DAT_01f7aa00;
                        aVar67 = _DAT_01f7a9f0;
                        do {
                          if (uVar37 < local_100) {
                            uVar17 = *(uint *)(lVar5 + 4 + lVar31) * uVar19;
                            sVar6 = pBVar23[lVar15 + -1].super_RawBufferView.stride;
                            pauVar22 = (undefined1 (*) [16])
                                       (pBVar23[lVar15 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar31) + uVar21 + uVar17) * sVar6);
                            lVar14 = uVar26 - uVar21;
                            do {
                              auVar41 = *pauVar22;
                              auVar8._4_4_ = -(uint)(auVar41._4_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar41._4_4_);
                              auVar8._0_4_ = -(uint)(auVar41._0_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar41._0_4_);
                              auVar8._8_4_ = -(uint)(auVar41._8_4_ < 1.844e+18 &&
                                                    -1.844e+18 < auVar41._8_4_);
                              auVar8._12_4_ =
                                   -(uint)(auVar41._12_4_ < 1.844e+18 && -1.844e+18 < auVar41._12_4_
                                          );
                              uVar13 = movmskps((int)uVar17,auVar8);
                              uVar17 = (ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
                              aVar75 = _DAT_01f7aa00;
                              aVar79 = _DAT_01f7a9f0;
                              if ((~(byte)uVar13 & 7) != 0) goto LAB_009eb752;
                              aVar67.m128 = (__m128)minps(aVar67.m128,auVar41);
                              aVar56.m128 = (__m128)maxps(aVar56.m128,auVar41);
                              pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar6);
                              lVar14 = lVar14 + -1;
                            } while (lVar14 != 0);
                          }
                          uVar19 = uVar19 + 1;
                          aVar75 = aVar56;
                          aVar79 = aVar67;
                        } while (uVar19 != uVar11);
                      }
                      goto LAB_009eb752;
                    }
LAB_009eb566:
                    fVar28 = fVar34 - fVar35;
                    if (fVar34 - fVar35 <= 0.0) {
                      fVar28 = 0.0;
                    }
                    fVar35 = 1.0 - fVar28;
                    auVar46._4_4_ = fVar35 * aVar45.y + fVar28 * aVar54.y;
                    auVar46._0_4_ = fVar35 * aVar45.x + fVar28 * aVar54.x;
                    auVar69._0_4_ = fVar35 * aVar59.x + fVar28 * aVar66.x;
                    auVar69._4_4_ = fVar35 * aVar59.y + fVar28 * aVar66.y;
                    auVar69._8_4_ = fVar35 * aVar59.z + fVar28 * aVar66.z;
                    fVar34 = fVar36 - __x;
                    if (fVar36 - __x <= 0.0) {
                      fVar34 = 0.0;
                    }
                    fVar33 = 1.0 - fVar34;
                    auVar55._0_4_ = aVar54.x * fVar33 + aVar45.x * fVar34;
                    auVar55._4_4_ = aVar54.y * fVar33 + aVar45.y * fVar34;
                    auVar55._8_4_ = aVar54.z * fVar33 + aVar45.z * fVar34;
                    auVar74._0_4_ = fVar33 * aVar66.x + fVar34 * aVar59.x;
                    auVar74._4_4_ = fVar33 * aVar66.y + fVar34 * aVar59.y;
                    auVar74._8_4_ = fVar33 * aVar66.z + fVar34 * aVar59.z;
                    auVar46._8_4_ = fVar35 * aVar45.z + fVar28 * aVar54.z;
                  }
                  else {
                    aVar48 = _DAT_01f7a9f0;
                    aVar47 = _DAT_01f7a9f0;
                    aVar61 = _DAT_01f7aa00;
                    aVar60 = _DAT_01f7aa00;
                    aVar45 = aVar54;
                    aVar59 = aVar66;
                    if (iVar10 - iVar9 == 1) goto LAB_009eb566;
LAB_009eb752:
                    fVar34 = fVar34 - fVar35;
                    if (fVar34 <= 0.0) {
                      fVar34 = 0.0;
                    }
                    fVar35 = 1.0 - fVar34;
                    auVar46._0_4_ = aVar48.m128[0] * fVar35 + aVar62.m128[0] * fVar34;
                    auVar46._4_4_ = aVar48.m128[1] * fVar35 + aVar62.m128[1] * fVar34;
                    auVar46._8_4_ = aVar48.m128[2] * fVar35 + aVar62.m128[2] * fVar34;
                    auVar49._12_4_ = aVar48.m128[3] * fVar35 + aVar62.m128[3] * fVar34;
                    auVar49._0_12_ = auVar46;
                    auVar69._0_4_ = fVar35 * aVar61.m128[0] + fVar34 * aVar39.m128[0];
                    auVar69._4_4_ = fVar35 * aVar61.m128[1] + fVar34 * aVar39.m128[1];
                    auVar69._8_4_ = fVar35 * aVar61.m128[2] + fVar34 * aVar39.m128[2];
                    auVar70._12_4_ = fVar35 * aVar61.m128[3] + fVar34 * aVar39.m128[3];
                    auVar70._0_12_ = auVar69;
                    fVar36 = fVar36 - __x;
                    if (fVar36 <= 0.0) {
                      fVar36 = 0.0;
                    }
                    fVar34 = 1.0 - fVar36;
                    auVar55._0_4_ = aVar47.m128[0] * fVar34 + aVar79.m128[0] * fVar36;
                    auVar55._4_4_ = aVar47.m128[1] * fVar34 + aVar79.m128[1] * fVar36;
                    auVar55._8_4_ = aVar47.m128[2] * fVar34 + aVar79.m128[2] * fVar36;
                    auVar57._12_4_ = aVar47.m128[3] * fVar34 + aVar79.m128[3] * fVar36;
                    auVar57._0_12_ = auVar55;
                    auVar74._0_4_ = fVar34 * aVar60.m128[0] + fVar36 * aVar75.m128[0];
                    auVar74._4_4_ = fVar34 * aVar60.m128[1] + fVar36 * aVar75.m128[1];
                    auVar74._8_4_ = fVar34 * aVar60.m128[2] + fVar36 * aVar75.m128[2];
                    auVar76._12_4_ = fVar34 * aVar60.m128[3] + fVar36 * aVar75.m128[3];
                    auVar76._0_12_ = auVar74;
                    if ((int)(iVar9 + 1U) < iVar10) {
                      uVar26 = (ulong)(iVar9 + 1U);
                      if (uVar24 <= uVar29) {
                        uVar29 = uVar24;
                      }
                      do {
                        aVar39 = _DAT_01f7aa00;
                        aVar62 = _DAT_01f7a9f0;
                        if (uVar12 < local_168) {
                          pBVar23 = (this->super_GridMesh).vertices.items + uVar26;
                          uVar19 = local_148;
                          aVar75 = _DAT_01f7aa00;
                          aVar79 = _DAT_01f7a9f0;
                          do {
                            if (uVar37 < local_100) {
                              uVar17 = *(uint *)(lVar5 + 4 + lVar31) * uVar19;
                              sVar6 = (pBVar23->super_RawBufferView).stride;
                              pauVar22 = (undefined1 (*) [16])
                                         ((pBVar23->super_RawBufferView).ptr_ofs +
                                         (*(uint *)(lVar5 + lVar31) + uVar21 + uVar17) * sVar6);
                              lVar14 = uVar29 - uVar21;
                              do {
                                auVar41 = *pauVar22;
                                auVar81._0_4_ =
                                     -(uint)(auVar41._0_4_ < 1.844e+18 && -1.844e+18 < auVar41._0_4_
                                            );
                                auVar81._4_4_ =
                                     -(uint)(auVar41._4_4_ < 1.844e+18 && -1.844e+18 < auVar41._4_4_
                                            );
                                auVar81._8_4_ =
                                     -(uint)(auVar41._8_4_ < 1.844e+18 && -1.844e+18 < auVar41._8_4_
                                            );
                                auVar81._12_4_ =
                                     -(uint)(auVar41._12_4_ < 1.844e+18 &&
                                            -1.844e+18 < auVar41._12_4_);
                                uVar13 = movmskps((int)uVar17,auVar81);
                                uVar17 = (ulong)CONCAT31((int3)((uint)uVar13 >> 8),~(byte)uVar13);
                                aVar39 = _DAT_01f7aa00;
                                aVar62 = _DAT_01f7a9f0;
                                if ((~(byte)uVar13 & 7) != 0) goto LAB_009eb89a;
                                aVar79.m128 = (__m128)minps(aVar79.m128,auVar41);
                                aVar75.m128 = (__m128)maxps(aVar75.m128,auVar41);
                                pauVar22 = (undefined1 (*) [16])(*pauVar22 + sVar6);
                                lVar14 = lVar14 + -1;
                              } while (lVar14 != 0);
                            }
                            uVar19 = uVar19 + 1;
                            aVar39 = aVar75;
                            aVar62 = aVar79;
                          } while (uVar19 != uVar11);
                        }
LAB_009eb89a:
                        fVar34 = ((float)(int)uVar26 / fVar28 - fVar53) / (fVar52 - fVar53);
                        fVar35 = 1.0 - fVar34;
                        auVar63._0_4_ =
                             aVar62.m128[0] - (auVar49._0_4_ * fVar35 + auVar57._0_4_ * fVar34);
                        auVar63._4_4_ =
                             aVar62.m128[1] - (auVar49._4_4_ * fVar35 + auVar57._4_4_ * fVar34);
                        auVar63._8_4_ =
                             aVar62.m128[2] - (auVar49._8_4_ * fVar35 + auVar57._8_4_ * fVar34);
                        auVar63._12_4_ =
                             aVar62.m128[3] - (auVar49._12_4_ * fVar35 + auVar57._12_4_ * fVar34);
                        auVar40._0_4_ =
                             aVar39.m128[0] - (fVar35 * auVar70._0_4_ + fVar34 * auVar76._0_4_);
                        auVar40._4_4_ =
                             aVar39.m128[1] - (fVar35 * auVar70._4_4_ + fVar34 * auVar76._4_4_);
                        auVar40._8_4_ =
                             aVar39.m128[2] - (fVar35 * auVar70._8_4_ + fVar34 * auVar76._8_4_);
                        auVar40._12_4_ =
                             aVar39.m128[3] - (fVar35 * auVar70._12_4_ + fVar34 * auVar76._12_4_);
                        auVar64 = minps(auVar63,ZEXT816(0));
                        auVar41 = maxps(auVar40,ZEXT816(0));
                        auVar46._0_4_ = auVar49._0_4_ + auVar64._0_4_;
                        auVar46._4_4_ = auVar49._4_4_ + auVar64._4_4_;
                        auVar46._8_4_ = auVar49._8_4_ + auVar64._8_4_;
                        auVar49._12_4_ = auVar49._12_4_ + auVar64._12_4_;
                        auVar49._0_12_ = auVar46;
                        auVar55._0_4_ = auVar57._0_4_ + auVar64._0_4_;
                        auVar55._4_4_ = auVar57._4_4_ + auVar64._4_4_;
                        auVar55._8_4_ = auVar57._8_4_ + auVar64._8_4_;
                        auVar57._12_4_ = auVar57._12_4_ + auVar64._12_4_;
                        auVar57._0_12_ = auVar55;
                        auVar69._0_4_ = auVar70._0_4_ + auVar41._0_4_;
                        auVar69._4_4_ = auVar70._4_4_ + auVar41._4_4_;
                        auVar69._8_4_ = auVar70._8_4_ + auVar41._8_4_;
                        auVar70._12_4_ = auVar70._12_4_ + auVar41._12_4_;
                        auVar70._0_12_ = auVar69;
                        auVar74._0_4_ = auVar76._0_4_ + auVar41._0_4_;
                        auVar74._4_4_ = auVar76._4_4_ + auVar41._4_4_;
                        auVar74._8_4_ = auVar76._8_4_ + auVar41._8_4_;
                        auVar76._12_4_ = auVar76._12_4_ + auVar41._12_4_;
                        auVar76._0_12_ = auVar74;
                        uVar26 = uVar26 + 1;
                      } while (iVar10 != (int)uVar26);
                    }
                  }
                  fVar28 = (float)((this->super_GridMesh).super_Geometry.numTimeSteps - 1);
                  uVar21 = (ulong)(uint)fVar28;
                  aVar50.m128[3] = (float)geomID;
                  aVar50._0_12_ = auVar46;
                  aVar71.m128[3] = (float)local_f8;
                  aVar71._0_12_ = auVar69;
                  aVar58.m128[3] = fVar28;
                  aVar58._0_12_ = auVar55;
                  aVar77.m128[3] = fVar28;
                  aVar77._0_12_ = auVar74;
                  auVar42._0_4_ =
                       auVar69._0_4_ * 0.5 + auVar74._0_4_ * 0.5 +
                       auVar46._0_4_ * 0.5 + auVar55._0_4_ * 0.5;
                  auVar42._4_4_ =
                       auVar69._4_4_ * 0.5 + auVar74._4_4_ * 0.5 +
                       auVar46._4_4_ * 0.5 + auVar55._4_4_ * 0.5;
                  auVar42._8_4_ =
                       auVar69._8_4_ * 0.5 + auVar74._8_4_ * 0.5 +
                       auVar46._8_4_ * 0.5 + auVar55._8_4_ * 0.5;
                  auVar42._12_4_ =
                       (float)local_f8 * 0.5 + fVar28 * 0.5 + (float)geomID * 0.5 + fVar28 * 0.5;
                  local_110 = local_110 + 1;
                  local_180 = local_180 + uVar21;
                  uVar29 = uVar21;
                  if (uVar21 < sVar30) {
                    uVar29 = sVar30;
                  }
                  uVar18 = uVar37 + 2;
                  local_50 = (uint)uVar24;
                  aVar65.m128 = (__m128)minps(aVar65.m128,auVar42);
                  aVar68.m128 = (__m128)maxps(aVar68.m128,auVar42);
                  BVar2 = (this->super_GridMesh).super_Geometry.time_range;
                  aVar84.m128 = (__m128)minps(aVar84.m128,aVar50.m128);
                  sgrids->items[local_f8] =
                       (SubGridBuildData)
                       ((ulong)(uVar37 & 0xfffe | (uint)(local_50 <= uVar18) << 0xf) |
                       (ulong)(uVar12 << 0x10 | (uint)(local_168 <= uVar12 + 2) << 0x1f) |
                       uVar32 << 0x20);
                  pPVar7 = prims->items;
                  pPVar7[local_f8].lbounds.bounds0.lower.field_0 = aVar50;
                  aVar82.m128 = (__m128)maxps(aVar82.m128,aVar71.m128);
                  pPVar7[local_f8].lbounds.bounds0.upper.field_0 = aVar71;
                  aVar80.m128 = (__m128)minps(aVar80.m128,aVar58.m128);
                  pPVar7[local_f8].lbounds.bounds1.lower.field_0 = aVar58;
                  aVar72.m128 = (__m128)maxps(aVar72.m128,aVar77.m128);
                  fVar28 = BVar2.lower;
                  if (fVar28 <= fVar51) {
                    fVar51 = fVar28;
                  }
                  pPVar7[local_f8].lbounds.bounds1.upper.field_0 = aVar77;
                  fVar35 = BVar2.upper;
                  pPVar7[local_f8].time_range = BVar2;
                  fVar34 = fVar35;
                  if (fVar35 <= fVar73) {
                    fVar34 = fVar73;
                  }
                  fVar73 = fVar34;
                  uVar37 = (int)((uint)(sVar30 < uVar21) << 0x1f) >> 0x1f;
                  uVar43 = (int)((uint)(sVar30 < uVar21) << 0x1f) >> 0x1f;
                  fVar38 = (float)(~uVar37 & (uint)fVar38 | (uint)fVar28 & uVar37);
                  fVar44 = (float)(~uVar43 & (uint)fVar44 | (uint)fVar35 & uVar43);
                  local_f8 = local_f8 + 1;
                  uVar3 = *(ushort *)(lVar5 + 8 + lVar31);
                  uVar24 = (ulong)uVar3;
                  sVar30 = uVar29;
                  uVar37 = uVar18;
                } while (uVar18 < uVar3 - 1);
                uVar11 = (ulong)*(ushort *)(lVar5 + 10 + lVar31);
              }
              local_148 = (ulong)(uVar12 + 2);
            } while (uVar12 + 2 < (int)uVar11 - 1U);
            uVar27 = r->_end;
          }
        }
      }
LAB_009ebb00:
      uVar32 = uVar32 + 1;
    } while (uVar32 < uVar27);
    (__return_storage_ptr__->object_range)._end = local_110;
  }
  else {
    fVar38 = 0.0;
    fVar44 = 1.0;
    fVar51 = 1.0;
    fVar73 = 0.0;
    uVar29 = 0;
    local_180 = 0;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar84;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar82;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar80;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar72;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar68;
  (__return_storage_ptr__->time_range).lower = fVar51;
  (__return_storage_ptr__->time_range).upper = fVar73;
  __return_storage_ptr__->num_time_segments = local_180;
  __return_storage_ptr__->max_num_time_segments = uVar29;
  (__return_storage_ptr__->max_time_range).lower = fVar38;
  (__return_storage_ptr__->max_time_range).upper = fVar44;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }